

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

void doinsert(parse *p,sop op,size_t opnd,sopno pos)

{
  sop *psVar1;
  sop sVar2;
  long lVar3;
  
  if (p->error != 0) {
    return;
  }
  lVar3 = p->slen;
  doemit(p,op,opnd);
  psVar1 = p->strip;
  sVar2 = psVar1[lVar3];
  for (lVar3 = 0; lVar3 != 9; lVar3 = lVar3 + 1) {
    if (pos <= p->pbegin[lVar3 + 1]) {
      p->pbegin[lVar3 + 1] = p->pbegin[lVar3 + 1] + 1;
    }
    if (pos <= p->pend[lVar3 + 1]) {
      p->pend[lVar3 + 1] = p->pend[lVar3 + 1] + 1;
    }
  }
  memmove(psVar1 + pos + 1,psVar1 + pos,(~pos + p->slen) * 8);
  p->strip[pos] = sVar2;
  return;
}

Assistant:

static void
doinsert(p, op, opnd, pos)
register struct parse *p;
sop op;
size_t opnd;
sopno pos;
{
	register sopno sn;
	register sop s;
	register int i;

	/* avoid making error situations worse */
	if (p->error != 0)
		return;

	sn = HERE();
	EMIT(op, opnd);		/* do checks, ensure space */
	assert(HERE() == sn+1);
	s = p->strip[sn];

	/* adjust paren pointers */
	assert(pos > 0);
	for (i = 1; i < NPAREN; i++) {
		if (p->pbegin[i] >= pos) {
			p->pbegin[i]++;
		}
		if (p->pend[i] >= pos) {
			p->pend[i]++;
		}
	}

	memmove((char *)&p->strip[pos+1], (char *)&p->strip[pos],
						(HERE()-pos-1)*sizeof(sop));
	p->strip[pos] = s;
}